

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O1

void __thiscall IMLE::predictInverseSingle(IMLE *this,X *x)

{
  Mat *this_00;
  ArrayZZ *this_01;
  ArrayScal *this_02;
  double *pdVar1;
  pointer pMVar2;
  pointer pMVar3;
  pointer pMVar4;
  pointer pMVar5;
  pointer pdVar6;
  pointer pFVar7;
  double *pdVar8;
  iterator iVar9;
  pointer piVar10;
  double dVar11;
  undefined8 uVar12;
  int iVar13;
  double *pdVar14;
  undefined8 *puVar15;
  Index index;
  ulong uVar16;
  Index index_1;
  long lVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  Index index_4;
  long lVar22;
  Index size;
  pointer pMVar23;
  pointer pMVar24;
  ArrayZ *this_03;
  ActualDstType actualDst;
  Z *pZVar25;
  Z *pZVar26;
  double dVar27;
  ZZ invVar;
  type tmp;
  ZZ sumInvRj;
  redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
  local_f8;
  undefined1 local_d0 [32];
  Mat *local_b0;
  variable_if_dynamic<long,__1> local_a8;
  variable_if_dynamic<long,__1> vStack_a0;
  Z *local_98;
  double local_90;
  ArrayZZ *local_80;
  X *local_78;
  value_type local_70;
  DenseStorage<double,__1,__1,__1,_0> local_58;
  Mat *local_40;
  Mat *local_38;
  
  local_78 = x;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            (&local_58,(DenseStorage<double,__1,__1,__1,_0> *)&this->zeroZZ);
  this_00 = &this->sumInvRzj;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)this_00,(long)this->d,(long)this->d,1);
  lVar17 = (this->sumInvRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_cols *
           (this->sumInvRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_rows;
  if (0 < lVar17) {
    memset((this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
           m_data,0,lVar17 * 8);
  }
  pMVar2 = (this->invPredictions).
           super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pMVar3 = (this->invPredictions).
           super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pMVar23 = pMVar2;
  if (pMVar3 != pMVar2) {
    do {
      free((pMVar23->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
           m_data);
      pMVar23 = pMVar23 + 1;
    } while (pMVar23 != pMVar3);
    (this->invPredictions).
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pMVar2;
  }
  pMVar4 = (this->invPredictionsVar).
           super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pMVar5 = (this->invPredictionsVar).
           super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pMVar24 = pMVar4;
  if (pMVar5 != pMVar4) {
    do {
      free((pMVar24->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
           m_data);
      pMVar24 = pMVar24 + 1;
    } while (pMVar24 != pMVar5);
    (this->invPredictionsVar).
    super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pMVar4;
  }
  pdVar6 = (this->invPredictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->invPredictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar6) {
    (this->invPredictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar6;
  }
  if ((this->sum_p_x).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
      m_rows != 1) {
    free((this->sum_p_x).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
         m_data);
    pdVar14 = (double *)malloc(8);
    if (pdVar14 == (double *)0x0) goto LAB_0014cbb9;
    (this->sum_p_x).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
         = pdVar14;
  }
  (this->sum_p_x).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       1;
  *(this->sum_p_x).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       0.0;
  local_80 = &this->iInvRj;
  pMVar4 = (this->iInvRj).
           super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pMVar5 = (this->iInvRj).
           super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pMVar24 = pMVar4;
  if (pMVar5 != pMVar4) {
    do {
      free((pMVar24->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
           m_data);
      pMVar24 = pMVar24 + 1;
    } while (pMVar24 != pMVar5);
    (this->iInvRj).
    super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pMVar4;
  }
  std::
  vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::reserve(local_80,(long)this->M);
  lVar22 = (long)this->d;
  lVar17 = (long)this->M;
  if ((lVar17 != 0 && lVar22 != 0) &&
     (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar17),0) < lVar22)) {
LAB_0014cbb9:
    puVar15 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar15 = operator_delete;
    __cxa_throw(puVar15,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  local_38 = &this->invRzj;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)local_38,lVar17 * lVar22,lVar22,lVar17);
  iVar13 = this->M;
  lVar17 = (long)iVar13;
  if ((this->zInvRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
      m_rows != lVar17) {
    free((this->zInvRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
         m_data);
    if (iVar13 < 1) {
      pdVar14 = (double *)0x0;
    }
    else {
      pdVar14 = (double *)malloc(lVar17 * 8);
      if (pdVar14 == (double *)0x0) goto LAB_0014cbb9;
    }
    (this->zInvRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
         = pdVar14;
  }
  (this->zInvRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       lVar17;
  local_40 = this_00;
  if ((local_78->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows ==
      (long)this->D) {
    if (0 < this->M) {
      lVar17 = 0;
      pZVar25 = (Z *)0x0;
      do {
        pZVar26 = (Z *)LinearExpert::queryX
                                 (&(this->experts).
                                   super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                                   .
                                   super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                                   ._M_impl.super__Vector_impl_data._M_start[(long)pZVar25].
                                   super_LinearExpert,local_78);
        pFVar7 = (this->experts).
                 super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                 .
                 super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_d0._0_8_ = &pFVar7[(long)pZVar25].super_LinearExpert.pred_z_invVar;
        local_d0._8_8_ =
             *(Index *)((long)&pFVar7[(long)pZVar25].super_LinearExpert.pred_z_invVar + 8);
        local_d0._16_8_ =
             *(Index *)((long)&pFVar7[(long)pZVar25].super_LinearExpert.pred_z_invVar + 0x10);
        local_d0._24_8_ = pZVar26;
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
        PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_f8,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                    *)local_d0);
        std::
        vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
        ::push_back(local_80,(value_type *)&local_f8);
        free((void *)local_f8.
                     super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                     .
                     super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                     .m_d._0_8_);
        local_f8.
        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
        .
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
        .m_d._0_8_ = (this->iInvRj).
                     super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + (long)pZVar25;
        local_f8.
        super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
        .
        super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
        .m_d.lhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
        super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.data =
             (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
             &(this->experts).
              super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
              .
              super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
              ._M_impl.super__Vector_impl_data._M_start[(long)pZVar25].super_LinearExpert.pred_z;
        pdVar14 = (this->invRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_data;
        uVar20 = (this->invRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows;
        Eigen::Matrix<double,-1,1,0,-1,1>::
        Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
                  ((Matrix<double,_1,1,0,_1,1> *)local_d0,
                   (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
                    *)&local_f8);
        uVar16 = uVar20;
        if ((((ulong)(pdVar14 + uVar20 * (long)pZVar25) & 7) == 0) &&
           (uVar16 = (ulong)((uint)((ulong)(pdVar14 + uVar20 * (long)pZVar25) >> 3) & 1),
           (long)uVar20 <= (long)uVar16)) {
          uVar16 = uVar20;
        }
        if (0 < (long)uVar16) {
          uVar19 = 0;
          do {
            *(undefined8 *)((long)pdVar14 + uVar19 * 8 + uVar20 * lVar17) =
                 *(undefined8 *)(local_d0._0_8_ + uVar19 * 8);
            uVar19 = uVar19 + 1;
          } while (uVar16 != uVar19);
        }
        lVar22 = uVar20 - uVar16;
        uVar19 = (lVar22 - (lVar22 >> 0x3f) & 0xfffffffffffffffeU) + uVar16;
        if (1 < lVar22) {
          do {
            uVar12 = *(undefined8 *)((pointer)(local_d0._0_8_ + uVar16 * 8) + 8);
            puVar15 = (undefined8 *)((long)pdVar14 + uVar16 * 8 + uVar20 * lVar17);
            *puVar15 = *(undefined8 *)(local_d0._0_8_ + uVar16 * 8);
            puVar15[1] = uVar12;
            uVar16 = uVar16 + 2;
          } while ((long)uVar16 < (long)uVar19);
        }
        if ((long)uVar19 < (long)uVar20) {
          do {
            *(undefined8 *)((long)pdVar14 + uVar19 * 8 + uVar20 * lVar17) =
                 *(undefined8 *)(local_d0._0_8_ + uVar19 * 8);
            uVar19 = uVar19 + 1;
          } while (uVar20 != uVar19);
        }
        free((void *)local_d0._0_8_);
        local_d0._0_8_ =
             &(this->experts).
              super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
              .
              super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
              ._M_impl.super__Vector_impl_data._M_start[(long)pZVar25].super_LinearExpert.pred_z;
        local_d0._16_8_ =
             (this->invRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_rows;
        local_d0._8_8_ =
             (this->invRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_data + local_d0._16_8_ * (long)pZVar25;
        local_b0 = local_38;
        local_a8.m_value = 0;
        vStack_a0.m_value = (long)pZVar25;
        local_98 = (Z *)local_d0._16_8_;
        if ((Z *)local_d0._16_8_ == (Z *)0x0) {
          dVar27 = 0.0;
        }
        else {
          local_f8.
          super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
          .
          super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
          .m_d.lhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.data
               = (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
                 (((Z *)local_d0._0_8_)->
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
          local_f8.
          super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
          .
          super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
          .m_d.rhsImpl.
          super_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>.
          super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
          .m_outerStride.m_value =
               (local_38->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
               m_storage.m_rows;
          local_f8.
          super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
          .
          super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
          .m_d.rhsImpl.
          super_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>.
          super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
          super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
          .m_data = (PointerType)local_d0._8_8_;
          dVar27 = Eigen::internal::
                   redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>const>>,3,0>
                   ::
                   run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>const>>
                             (&local_f8,(scalar_sum_op<double,_double> *)&local_70,
                              (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                               *)local_d0);
        }
        (this->zInvRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_data[(long)pZVar25] = dVar27;
        pdVar14 = (this->sum_p_x).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_data;
        *pdVar14 = (double)pZVar26 + *pdVar14;
        lVar22 = (long)(this->iInvRj).
                       super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[(long)pZVar25].
                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                       m_data;
        lVar18 = local_58.m_cols * local_58.m_rows;
        uVar20 = lVar18 - (lVar18 >> 0x3f) & 0xfffffffffffffffe;
        if (1 < lVar18) {
          lVar21 = 0;
          do {
            pdVar14 = (double *)(lVar22 + lVar21 * 8);
            dVar11 = pdVar14[1];
            dVar27 = (local_58.m_data + lVar21)[1];
            local_58.m_data[lVar21] = *pdVar14 + local_58.m_data[lVar21];
            (local_58.m_data + lVar21)[1] = dVar11 + dVar27;
            lVar21 = lVar21 + 2;
          } while (lVar21 < (long)uVar20);
        }
        if ((long)uVar20 < lVar18) {
          do {
            local_58.m_data[uVar20] = *(double *)(lVar22 + uVar20 * 8) + local_58.m_data[uVar20];
            uVar20 = uVar20 + 1;
          } while (lVar18 - uVar20 != 0);
        }
        pdVar14 = (this->invRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_data;
        lVar22 = (this->invRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows;
        pdVar8 = (this->sumInvRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data;
        uVar20 = (this->sumInvRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows;
        uVar16 = uVar20;
        if ((((ulong)pdVar8 & 7) == 0) &&
           (uVar16 = (ulong)((uint)((ulong)pdVar8 >> 3) & 1), (long)uVar20 <= (long)uVar16)) {
          uVar16 = uVar20;
        }
        if (0 < (long)uVar16) {
          uVar19 = 0;
          do {
            pdVar8[uVar19] =
                 *(double *)((long)pdVar14 + uVar19 * 8 + lVar22 * lVar17) + pdVar8[uVar19];
            uVar19 = uVar19 + 1;
          } while (uVar16 != uVar19);
        }
        lVar18 = uVar20 - uVar16;
        uVar19 = (lVar18 - (lVar18 >> 0x3f) & 0xfffffffffffffffeU) + uVar16;
        if (1 < lVar18) {
          do {
            pdVar1 = (double *)((long)pdVar14 + uVar16 * 8 + lVar22 * lVar17);
            dVar11 = pdVar1[1];
            dVar27 = (pdVar8 + uVar16)[1];
            pdVar8[uVar16] = *pdVar1 + pdVar8[uVar16];
            (pdVar8 + uVar16)[1] = dVar11 + dVar27;
            uVar16 = uVar16 + 2;
          } while ((long)uVar16 < (long)uVar19);
        }
        if ((long)uVar19 < (long)uVar20) {
          do {
            pdVar8[uVar19] =
                 *(double *)((long)pdVar14 + uVar19 * 8 + lVar22 * lVar17) + pdVar8[uVar19];
            uVar19 = uVar19 + 1;
          } while (uVar20 != uVar19);
        }
        pZVar25 = (Z *)((long)&(pZVar25->
                               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                               m_storage.m_data + 1);
        lVar17 = lVar17 + 8;
      } while ((long)pZVar25 < (long)this->M);
    }
  }
  else {
    local_d0._0_8_ = (Z *)(local_d0 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d0,"IMLE::predict: query dimension does not match output dimension!!"
               ,"");
    message(this,(string *)local_d0);
    if ((Z *)local_d0._0_8_ != (Z *)(local_d0 + 0x10)) {
      operator_delete((void *)local_d0._0_8_);
    }
    if ((this->sum_p_x).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_rows != 1) {
      free((this->sum_p_x).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data);
      pdVar14 = (double *)malloc(8);
      if (pdVar14 == (double *)0x0) goto LAB_0014cbb9;
      (this->sum_p_x).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
      m_data = pdVar14;
    }
    (this->sum_p_x).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
         = 1;
    *(this->sum_p_x).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
         = 0.0;
  }
  this_03 = &this->invPredictions;
  this_01 = &this->invPredictionsVar;
  this_02 = &this->invPredictionsWeight;
  pdVar14 = (this->sum_p_x).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
            .m_data;
  this->sumAll = *pdVar14 + this->pNoiseModelX;
  dVar27 = *pdVar14;
  if ((dVar27 != 0.0) || (NAN(dVar27))) {
    dVar27 = (this->param).multiValuedSignificance;
    if ((dVar27 != 0.0) || (NAN(dVar27))) {
      local_d0._0_8_ = &local_58;
      local_f8.
      super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
      .
      super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
      .m_d._0_8_ = (pointer)0x0;
      local_f8.
      super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
      .
      super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
      .m_d.lhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
      super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.data =
           (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
           (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>)0x0;
      local_f8.
      super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
      .
      super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
      .m_d.rhsImpl.
      super_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>.
      super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
      super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
      .m_data = (PointerType)0x0;
      if ((local_58.m_rows != 0 && local_58.m_cols != 0) &&
         (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(local_58.m_rows),0) <
          local_58.m_cols)) {
        puVar15 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar15 = operator_delete;
        __cxa_throw(puVar15,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                ((DenseStorage<double,__1,__1,__1,_0> *)&local_f8,local_58.m_rows * local_58.m_cols,
                 local_58.m_cols,local_58.m_rows);
      Eigen::internal::
      Assignment<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Inverse<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
      ::run((Matrix<double,__1,__1,_0,__1,__1> *)&local_f8,(SrcXprType *)local_d0,
            (assign_op<double,_double> *)&local_70);
      local_d0._8_8_ =
           (this->sumInvRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_data;
      local_d0._16_8_ =
           (this->sumInvRzj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_rows;
      local_b0 = local_40;
      local_a8.m_value = 0;
      vStack_a0.m_value = 0;
      local_d0._0_8_ = &local_f8;
      local_98 = (Z *)local_d0._16_8_;
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
      PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,0>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_70,
                 (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>_>
                  *)local_d0);
      std::
      vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::push_back(this_03,(value_type *)&local_70);
      free(local_70.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data);
      local_d0._24_8_ = this->sumAll;
      local_d0._8_8_ =
           local_f8.
           super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
           .
           super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
           .m_d.lhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
           super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.
           data;
      local_d0._16_8_ =
           local_f8.
           super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
           .
           super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
           .m_d.rhsImpl.
           super_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>.
           super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
           .m_data;
      local_d0._0_8_ = &local_f8;
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_70,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                  *)local_d0);
      std::
      vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
      ::push_back(this_01,&local_70);
      free(local_70.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data);
      local_d0._0_8_ =
           *(this->sum_p_x).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
            .m_data / this->sumAll;
      iVar9._M_current =
           (this->invPredictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar9._M_current ==
          (this->invPredictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert
                  (this_02,iVar9,(value_type *)local_d0);
      }
      else {
        *iVar9._M_current = (double)local_d0._0_8_;
        (this->invPredictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar9._M_current + 1;
      }
      free((void *)local_f8.
                   super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                   .
                   super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                   .m_d._0_8_);
      this->nInvSolFound = 1;
      piVar10 = (this->sNearestInv).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((this->sNearestInv).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish != piVar10) {
        (this->sNearestInv).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = piVar10;
      }
      std::vector<int,_std::allocator<int>_>::resize(&this->sNearestInv,(long)this->M,0);
      goto LAB_0014c9cb;
    }
    std::
    vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::reserve(this_03,(long)this->M);
    std::
    vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::reserve(this_01,(long)this->M);
    std::vector<double,_std::allocator<double>_>::reserve(this_02,(long)this->M);
    iVar13 = this->M;
    if (0 < iVar13) {
      lVar17 = 0x140;
      lVar22 = 0;
      do {
        std::
        vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
        ::push_back(this_03,(value_type *)
                            ((long)&(((this->experts).
                                      super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                                      .
                                      super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->super_LinearExpert
                                    ).Lambda + lVar17 + 0x10U));
        pdVar14 = (double *)
                  ((long)&(((this->experts).
                            super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                            .
                            super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                            ._M_impl.super__Vector_impl_data._M_start)->super_LinearExpert).d +
                  lVar17);
        local_d0._8_8_ = pdVar14 + 0x14;
        local_90 = *pdVar14;
        local_b0 = (Mat *)(this->pNoiseModelX + local_90);
        local_d0._16_8_ = pdVar14[0x15];
        local_d0._24_8_ = pdVar14[0x16];
        vStack_a0.m_value = local_d0._16_8_;
        local_98 = (Z *)local_d0._24_8_;
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
        PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_f8,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                    *)local_d0);
        std::
        vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
        ::push_back(this_01,(value_type *)&local_f8);
        free((void *)local_f8.
                     super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                     .
                     super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                     .m_d._0_8_);
        local_d0._0_8_ =
             *(double *)
              ((long)&(((this->experts).
                        super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                        .
                        super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                        ._M_impl.super__Vector_impl_data._M_start)->super_LinearExpert).d + lVar17)
             / this->sumAll;
        iVar9._M_current =
             (this->invPredictionsWeight).super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar9._M_current ==
            (this->invPredictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl
            .super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert
                    (this_02,iVar9,(value_type *)local_d0);
        }
        else {
          *iVar9._M_current = (double)local_d0._0_8_;
          (this->invPredictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar9._M_current + 1;
        }
        lVar22 = lVar22 + 1;
        iVar13 = this->M;
        lVar17 = lVar17 + 0x308;
      } while (lVar22 < iVar13);
    }
  }
  else {
    std::
    vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::push_back(this_03,&this->zeroZ);
    std::
    vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::push_back(this_01,&this->infinityZZ);
    local_d0._0_8_ = (Z *)0x0;
    iVar9._M_current =
         (this->invPredictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar9._M_current ==
        (this->invPredictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert
                (this_02,iVar9,(value_type *)local_d0);
    }
    else {
      *iVar9._M_current = 0.0;
      (this->invPredictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar9._M_current + 1;
    }
    iVar13 = 1;
  }
  this->nInvSolFound = iVar13;
LAB_0014c9cb:
  free(local_58.m_data);
  return;
}

Assistant:

IMLE_CLASS_TEMPLATE
void IMLE_base::predictInverseSingle(X const &x)
{
    // Aux variables
    ZZ sumInvRj = zeroZZ;
    sumInvRzj.setZero(d,1);

    // Clear predict data structure
    invPredictions.clear();
    invPredictionsVar.clear();
    invPredictionsWeight.clear();

    sum_p_x.resize(1);
    sum_p_x(0) = 0.0;
    iInvRj.clear(); iInvRj.reserve(M);
    invRzj.resize(d,M);
    zInvRzj.resize(M);

#ifdef IMLE_NO_TEMPLATES
    // Check dimensions
    if( x.size() != D )
    {
        message("IMLE::predict: query dimension does not match output dimension!!");

        sum_p_x.setZero(1);
    }
    else
#endif
        for(int j = 0; j < M; j++)
        {
            Scal p_x = experts[j].queryX(x);

            // These are needed for multivalued inverse prediction
            iInvRj.push_back(experts[j].getPredZInvVar() * p_x );
            invRzj.col(j) = iInvRj[j] * experts[j].getPredZ();
            zInvRzj(j) = experts[j].getPredZ().dot( invRzj.col(j) );

            sum_p_x(0) += p_x;
            sumInvRj += iInvRj[j];
            sumInvRzj.col(0) += invRzj.col(j);
        }
    sumAll = sum_p_x(0) + pNoiseModelX;

    if(sum_p_x(0) == 0.0)  // This happens when a prediction is sought too far from the current mixture
    {
        invPredictions.push_back(zeroZ);
        invPredictionsVar.push_back( infinityZZ );
        invPredictionsWeight.push_back(0.0);

        nInvSolFound = 1;
        return;
    }
    else if( param.multiValuedSignificance == 0.0 )
    {
        invPredictions.reserve(M);
        invPredictionsVar.reserve(M);
        invPredictionsWeight.reserve(M);

        for(int j = 0; j < M; j++)
        {
            invPredictions.push_back( experts[j].getPredZ() );
            invPredictionsVar.push_back( experts[j].getPredZVar() *(experts[j].get_p_x() + pNoiseModelX) / experts[j].get_p_x() );
            invPredictionsWeight.push_back(experts[j].get_p_x() / sumAll);
        }

        nInvSolFound = M;
        return;
    }
    else
    {
        ZZ invVar = sumInvRj.inverse();

        invPredictions.push_back( invVar * sumInvRzj.col(0) );
        invPredictionsVar.push_back( invVar * sumAll );
        invPredictionsWeight.push_back(sum_p_x(0) / sumAll );
    }

    nInvSolFound = 1;
    sNearestInv.clear();
    sNearestInv.resize(M,0);
}